

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O3

String __thiscall Bstrlib::String::operator+(String *this,double c)

{
  uchar *extraout_RDX;
  String *in_RSI;
  String SVar1;
  
  String(this,in_RSI);
  operator+=(this,c);
  SVar1.super_tagbstring.data = extraout_RDX;
  SVar1.super_tagbstring._0_8_ = this;
  return (String)SVar1.super_tagbstring;
}

Assistant:

const String String::operator+(const double c) const
    {
        String retval(*this);
        retval += c;
        return retval;
    }